

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O1

void __thiscall wasm::Vacuum::doWalkFunction(Vacuum *this,Function *func)

{
  ReFinalize local_188;
  
  Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::walk
            ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
             &(this->
              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
              ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
             &func->body);
  ReFinalize::ReFinalize(&local_188);
  local_188.
  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
  .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
  super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currModule =
       (this->
       super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
       ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
       super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
       super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule;
  local_188.
  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
  .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
  super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currFunction =
       func;
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walk
            (&local_188.
              super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
              .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
              super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
             &func->body);
  local_188.
  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
  .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
  super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currFunction =
       (Function *)0x0;
  local_188.
  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
  .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
  super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currModule =
       (Module *)0x0;
  local_188.
  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
  .super_Pass._vptr_Pass = (_func_int **)&PTR__ReFinalize_01090960;
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_188.breakTypes._M_h);
  if (local_188.
      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
      super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.stack.
      flexible.
      super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                    .
                    super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                    .
                    super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.
                          super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                          .
                          super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                          .
                          super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                          .
                          super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                          .
                          super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Pass::~Pass((Pass *)&local_188);
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    walk(func->body);
    ReFinalize().walkFunctionInModule(func, getModule());
  }